

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  HSQUIRRELVM in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQObjectPtr **in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  long lVar2;
  SQRESULT local_8;
  
  lVar2 = 0;
  bVar1 = sq_aux_gettypedarg(in_RSI,0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  if (bVar1) {
    if (*(long *)(*(long *)(lVar2 + 8) + 0x38) == 0) {
      SQVM::PushNull((SQVM *)0x11aea9);
    }
    else {
      SQObjectPtr::SQObjectPtr
                ((SQObjectPtr *)&stack0xffffffffffffffd0,*(SQClass **)(*(long *)(lVar2 + 8) + 0x38))
      ;
      SQVM::Push(in_RDI,in_stack_ffffffffffffffa8);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
    }
    local_8 = 0;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    if(_class(*o)->_base)
        v->Push(SQObjectPtr(_class(*o)->_base));
    else
        v->PushNull();
    return SQ_OK;
}